

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootwindow.cpp
# Opt level: O2

void __thiscall RootWindow::exampleClosed(RootWindow *this)

{
  Example *__filename;
  
  __filename = this->m_example;
  if (__filename != (Example *)0x0) {
    (this->super_StandardSurface).m_pointerEventReceiver = (Node *)0x0;
    rengine::Node::remove(&this->m_appLayer->super_Node,(char *)__filename);
    rengine::Node::remove(&this->m_appLayer->super_Node,(char *)this->m_closeButton);
    *(undefined4 *)&(this->m_appLayer->super_Node).field_0x34 = 0;
    (*(this->m_example->super_Node).super_SignalEmitter._vptr_SignalEmitter[6])();
    this->m_example = (Example *)0x0;
    return;
  }
  __assert_fail("m_example",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp"
                ,0x98,"void RootWindow::exampleClosed()");
}

Assistant:

void RootWindow::exampleClosed()
{
    assert(m_example);
    setPointerEventReceiver(nullptr);
    m_appLayer->remove(m_example);
    m_appLayer->remove(m_closeButton);
    m_appLayer->setOpacity(0);
    m_example->invalidate();
    m_example = 0;
}